

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O1

int __thiscall
TPZSparseBlockDiagonal<std::complex<float>_>::PutVal
          (TPZSparseBlockDiagonal<std::complex<float>_> *this,int64_t row,int64_t col,
          complex<float> *value)

{
  int iVar1;
  int64_t cblockindex;
  int64_t rblockindex;
  int64_t rblock;
  int64_t cblock;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  FindBlockIndex(this,row,&local_38,&local_40);
  iVar1 = -1;
  if (local_38 != -1) {
    FindBlockIndex(this,col,&local_30,&local_48);
    if (local_30 == local_38) {
      (this->super_TPZBlockDiagonal<std::complex<float>_>).fStorage.fStore
      [(this->super_TPZBlockDiagonal<std::complex<float>_>).fBlockPos.fStore[local_38] +
       local_40 +
       (this->super_TPZBlockDiagonal<std::complex<float>_>).fBlockSize.fStore[local_38] * local_48].
      _M_value = value->_M_value;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::PutVal(const int64_t row, const int64_t col, const TVar& value)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return -1;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return -1;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	this->fStorage[this->fBlockPos[rblock]+pos] = value;
	return 0;
}